

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall discordpp::Interaction::Interaction(Interaction *this,json *j)

{
  json *j_local;
  Interaction *this_local;
  
  field<discordpp::Snowflake>::field(&this->id);
  field<discordpp::Snowflake>::field(&this->application_id);
  field<discordpp::InteractionType>::field(&this->type);
  omittable_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
  ::omittable_field(&this->data);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->guild_id);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->channel_id);
  omittable_field<discordpp::GuildMember>::omittable_field(&this->member);
  omittable_field<discordpp::User>::omittable_field(&this->user);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->token);
  field<int>::field(&this->version);
  omittable_field<discordpp::Message>::omittable_field(&this->message);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->app_permissions);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->locale);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->guild_locale);
  discordpp::from_json(j,this);
  return;
}

Assistant:

Interaction(const json &j) { from_json(j, *this); }